

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

Vec3 __thiscall Sphere::GetCenter(Sphere *this,float t)

{
  bool bVar1;
  bool bVar2;
  Vec3 *v2;
  float *pfVar3;
  long in_RSI;
  float in_XMM0_Da;
  float fVar4;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  float in_XMM1_Da;
  Vec3 VVar5;
  Vec3 VVar6;
  Vec3 *in_stack_ffffffffffffff88;
  Vec3 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  Vec3 local_2c;
  Vec3 local_20;
  float local_14 [5];
  undefined8 uVar7;
  float fVar8;
  
  bVar2 = false;
  bVar1 = false;
  if (((*(byte *)(in_RSI + 0x30) & 1) == 0) ||
     (in_XMM1_Da = in_XMM0_Da, in_XMM0_Da <= *(float *)(in_RSI + 0x34))) {
    Vec3::Vec3(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    VVar5.e[2] = in_XMM1_Da;
    VVar5.e[0] = (float)(int)extraout_XMM0_Qa;
    VVar5.e[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  else {
    v2 = (Vec3 *)(in_RSI + 8);
    pfVar3 = std::min<float>(local_14,(float *)(in_RSI + 0x38));
    fVar4 = (*pfVar3 - *(float *)(in_RSI + 0x34)) /
            (*(float *)(in_RSI + 0x38) - *(float *)(in_RSI + 0x34));
    operator-((Vec3 *)CONCAT44(fVar4,in_stack_ffffffffffffff98),v2);
    bVar2 = true;
    operator*(fVar4,v2);
    bVar1 = true;
    VVar5 = operator+((Vec3 *)CONCAT44(fVar4,in_stack_ffffffffffffff98),v2);
  }
  fVar4 = VVar5.e[2];
  if (bVar1) {
    Vec3::~Vec3(&local_20);
    VVar5.e[2] = fVar4;
    VVar5.e[0] = (float)(int)extraout_XMM0_Qa_00;
    VVar5.e[1] = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  }
  fVar4 = VVar5.e[2];
  if (bVar2) {
    Vec3::~Vec3(&local_2c);
    VVar5.e[2] = fVar4;
    VVar5.e[0] = (float)(int)extraout_XMM0_Qa_01;
    VVar5.e[1] = (float)(int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  }
  VVar6.e[0] = VVar5.e[0];
  uVar7._4_4_ = VVar5.e[1];
  register0x00001240 = VVar5.e[2];
  return (Vec3)VVar6.e;
}

Assistant:

Vec3
Sphere::GetCenter(float t) const
{
    return (!m_animated || (t <= m_animation_start)) ? m_center :
    m_center + ((std::min(t, m_animation_end) - m_animation_start)/(m_animation_end - m_animation_start)) * (m_center_end - m_center);
}